

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

qpdf_offset_t __thiscall QPDF::getLinearizationOffset(QPDF *this,QPDFObjGen og)

{
  int iVar1;
  uint uVar2;
  mapped_type *pmVar3;
  qpdf_offset_t qVar4;
  QPDFObjGen og_00;
  QPDFXRefEntry entry;
  allocator<char> local_59;
  QPDFXRefEntry local_58;
  QPDFObjGen local_38;
  string local_30;
  
  local_38 = og;
  pmVar3 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::operator[](&((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,
                        &local_38);
  local_58.type = pmVar3->type;
  local_58._4_4_ = *(undefined4 *)&pmVar3->field_0x4;
  local_58.field1 = pmVar3->field1;
  local_58.field2 = pmVar3->field2;
  local_58._20_4_ = *(undefined4 *)&pmVar3->field_0x14;
  iVar1 = QPDFXRefEntry::getType(&local_58);
  if (iVar1 == 2) {
    uVar2 = QPDFXRefEntry::getObjStreamNumber(&local_58);
    og_00.gen = 0;
    og_00.obj = uVar2;
    qVar4 = getLinearizationOffset(this,og_00);
  }
  else if (iVar1 == 1) {
    qVar4 = QPDFXRefEntry::getOffset(&local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"getLinearizationOffset called for xref entry not of type 1 or 2"
               ,&local_59);
    stopOnError(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    qVar4 = 0;
  }
  return qVar4;
}

Assistant:

qpdf_offset_t
QPDF::getLinearizationOffset(QPDFObjGen og)
{
    QPDFXRefEntry entry = m->xref_table[og];
    qpdf_offset_t result = 0;
    switch (entry.getType()) {
    case 1:
        result = entry.getOffset();
        break;

    case 2:
        // For compressed objects, return the offset of the object stream that contains them.
        result = getLinearizationOffset(QPDFObjGen(entry.getObjStreamNumber(), 0));
        break;

    default:
        stopOnError("getLinearizationOffset called for xref entry not of type 1 or 2");
        break;
    }
    return result;
}